

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  bool bVar4;
  ImU32 IVar5;
  float *pfVar6;
  char *pcVar7;
  ImGuiTableColumn *pIVar8;
  uint in_ECX;
  int in_EDX;
  ImGuiID in_ESI;
  char *in_RDI;
  ImGuiWindowTempData *min;
  ImVec2 *in_R8;
  float in_XMM0_Da;
  float idx;
  float fVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [56];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  ImRect IVar18;
  int n_1;
  float scale_factor;
  float new_ref_scale_unit;
  float width_auto;
  ImGuiTableColumn *column;
  int n;
  int stored_size;
  int table_idx;
  float outer_padding_explicit;
  float outer_padding_for_border;
  float inner_padding_explicit;
  float inner_spacing_explicit;
  float inner_spacing_for_border;
  bool pad_inner_x;
  bool pad_outer_x;
  ImGuiWindow *inner_window;
  ImGuiWindowFlags child_flags;
  ImVec2 override_content_size;
  ImGuiTableFlags table_last_flags;
  ImGuiID instance_id;
  int instance_no;
  ImGuiTable *table;
  ImRect outer_rect;
  ImVec2 actual_outer_size;
  ImVec2 avail_size;
  bool use_child_window;
  ImGuiWindow *outer_window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  ImGuiTableColumnIdx IVar19;
  ImGuiID in_stack_fffffffffffffdf4;
  ImGuiTable *in_stack_fffffffffffffdf8;
  ImVector<ImGuiPtrOrIndex> *pIVar20;
  float in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  ImVec2 in_stack_fffffffffffffe08;
  ImRect *r;
  int columns_count_00;
  float fVar21;
  undefined4 uVar22;
  ImGuiWindowFlags in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined1 border;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  float local_1d8;
  ImGuiID in_stack_fffffffffffffe2c;
  uint in_stack_fffffffffffffe40;
  uint uVar23;
  float in_stack_fffffffffffffe44;
  float local_1b4;
  uint in_stack_fffffffffffffe50;
  uint uVar24;
  int iVar25;
  int local_190;
  undefined1 local_184 [104];
  float local_11c;
  ImGuiTableColumn *local_118;
  int local_10c;
  int local_108;
  undefined4 local_104;
  ImGuiPtrOrIndex local_100;
  ImPoolIdx local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  byte local_d2;
  undefined1 local_d1;
  ImVec2 local_d0;
  ImGuiWindow *local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  undefined8 local_b0;
  uint local_a8;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  uint local_8c;
  int local_88;
  int local_84;
  ImGuiTable *local_80;
  ImVec2 local_74;
  ImRect local_6c;
  ImVec2 local_5c;
  undefined8 local_54;
  undefined8 local_4c;
  byte local_41;
  ImGuiWindow *local_40;
  ImGuiContext *local_38;
  float local_2c;
  ImVec2 *local_28;
  uint local_1c;
  int local_18;
  ImGuiID local_14;
  char *local_10;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar17 [56];
  
  border = (undefined1)((uint)in_stack_fffffffffffffe1c >> 0x18);
  local_38 = GImGui;
  local_2c = in_XMM0_Da;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_40 = GetCurrentWindow();
  if ((local_40->SkipItems & 1U) != 0) {
    return false;
  }
  bVar4 = false;
  if ((0 < local_18) && (bVar4 = false, local_18 < 0x41)) {
    bVar4 = true;
  }
  if (!bVar4) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x133,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if (((local_1c & 0x1000000) != 0) && (local_2c < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x135,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  local_41 = (local_1c & 0x3000000) != 0;
  auVar10._0_8_ = GetContentRegionAvail();
  auVar10._8_56_ = extraout_var;
  local_4c = vmovlpd_avx(auVar10._0_16_);
  local_5c = *local_28;
  ImMax<float>((float)local_4c,1.0);
  if ((local_41 & 1) != 0) {
    ImMax<float>(local_4c._4_4_,1.0);
  }
  auVar11._0_8_ =
       CalcItemSize(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
  auVar11._8_56_ = extraout_var_00;
  local_54 = vmovlpd_avx(auVar11._0_16_);
  min = &local_40->DC;
  auVar12._0_8_ =
       ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   (ImVec2 *)0x238007);
  auVar12._8_56_ = extraout_var_01;
  local_74 = (ImVec2)vmovlpd_avx(auVar12._0_16_);
  ImRect::ImRect(&local_6c,&min->CursorPos,&local_74);
  if (((local_41 & 1) != 0) &&
     (bVar4 = IsClippedEx((ImRect *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                          SUB41((uint)in_stack_fffffffffffffdf0 >> 0x18,0)), bVar4)) {
    ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffdec);
    return false;
  }
  local_80 = ImPool<ImGuiTable>::GetOrAddByKey
                       ((ImPool<ImGuiTable> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
  if (local_80->LastFrameActive == local_38->FrameCount) {
    iVar25 = local_80->InstanceCurrent + 1;
  }
  else {
    iVar25 = 0;
  }
  local_88 = local_14 + iVar25;
  local_8c = local_80->Flags;
  uVar24 = in_stack_fffffffffffffe50;
  local_84 = iVar25;
  if (0 < iVar25) {
    uVar24 = in_stack_fffffffffffffe50 & 0xffffff;
    if (local_80->ColumnsCount == local_18) {
      uVar24 = CONCAT13(1,(int3)in_stack_fffffffffffffe50);
    }
    if ((char)(uVar24 >> 0x18) == '\0') {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x148,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  local_80->IsDefaultSizingPolicy = (local_1c & 0xe000) == 0;
  local_1c = TableFixFlags(local_1c,local_40);
  local_80->ID = local_14;
  local_80->Flags = local_1c;
  local_80->InstanceCurrent = (ImS16)local_84;
  local_80->LastFrameActive = local_38->FrameCount;
  local_80->InnerWindow = local_40;
  local_80->OuterWindow = local_40;
  local_80->ColumnsCount = local_18;
  local_80->IsLayoutLocked = false;
  local_80->InnerWidth = local_2c;
  local_80->UserOuterSize = *local_28;
  if ((local_41 & 1) == 0) {
    (local_80->InnerRect).Min = local_6c.Min;
    (local_80->InnerRect).Max = local_6c.Max;
    (local_80->OuterRect).Min = (local_80->InnerRect).Min;
    (local_80->OuterRect).Max = (local_80->InnerRect).Max;
    (local_80->WorkRect).Min = (local_80->OuterRect).Min;
    (local_80->WorkRect).Max = (local_80->OuterRect).Max;
    goto LAB_00238626;
  }
  ImVec2::ImVec2(&local_94,3.4028235e+38,3.4028235e+38);
  if (((local_1c & 0x1000000) != 0) && ((local_1c & 0x2000000) == 0)) {
    local_94.y = 1.1754944e-38;
  }
  if (((local_1c & 0x1000000) != 0) && (0.0 < local_2c)) {
    local_94.x = local_2c;
  }
  if ((local_94.x != 3.4028235e+38) || (NAN(local_94.x))) {
LAB_00238322:
    if ((local_94.x != 3.4028235e+38) || (NAN(local_94.x))) {
      local_1b4 = local_94.x;
    }
    else {
      local_1b4 = 0.0;
    }
    in_stack_fffffffffffffe44 = local_94.y;
    if ((local_94.y == 3.4028235e+38) && (!NAN(local_94.y))) {
      in_stack_fffffffffffffe44 = 0.0;
    }
    auVar17 = (undefined1  [56])0x0;
    ImVec2::ImVec2(&local_9c,local_1b4,in_stack_fffffffffffffe44);
    SetNextWindowContentSize
              ((ImVec2 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  else {
    auVar17 = (undefined1  [56])0x0;
    if ((local_94.y != 3.4028235e+38) || (NAN(local_94.y))) goto LAB_00238322;
  }
  uVar23 = in_stack_fffffffffffffe40;
  if ((local_8c & 0x3000000) == 0) {
    auVar17 = ZEXT856(0);
    ImVec2::ImVec2(&local_a4,0.0,0.0);
    SetNextWindowScroll(&local_a4);
    uVar23 = in_stack_fffffffffffffe40;
  }
  local_a8 = (local_1c & 0x1000000) >> 0xd;
  auVar13._0_8_ =
       ImRect::GetSize((ImRect *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  auVar13._8_56_ = extraout_var_02;
  local_b0 = vmovlpd_avx(auVar13._0_16_);
  BeginChildEx(local_10,in_stack_fffffffffffffe2c,
               (ImVec2 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),(bool)border,
               in_stack_fffffffffffffe18);
  local_80->InnerWindow = local_38->CurrentWindow;
  IVar3 = (local_80->InnerWindow->WorkRect).Max;
  auVar15 = ZEXT856((ulong)IVar3);
  (local_80->WorkRect).Min = (local_80->InnerWindow->WorkRect).Min;
  (local_80->WorkRect).Max = IVar3;
  IVar18 = ImGuiWindow::Rect((ImGuiWindow *)0x2384ac);
  auVar16._0_8_ = IVar18.Max;
  auVar16._8_56_ = auVar17;
  auVar14._0_8_ = IVar18.Min;
  auVar14._8_56_ = auVar15;
  local_c0 = (ImVec2)vmovlpd_avx(auVar14._0_16_);
  local_b8 = (ImVec2)vmovlpd_avx(auVar16._0_16_);
  (local_80->OuterRect).Min = local_c0;
  (local_80->OuterRect).Max = local_b8;
  pIVar2 = local_80->InnerWindow;
  (local_80->InnerRect).Min = (pIVar2->InnerRect).Min;
  (local_80->InnerRect).Max = (pIVar2->InnerRect).Max;
  fVar21 = (local_80->InnerWindow->WindowPadding).x;
  in_stack_fffffffffffffe40 = uVar23 & 0xffffff;
  if ((fVar21 == 0.0) && (!NAN(fVar21))) {
    fVar21 = (local_80->InnerWindow->WindowPadding).y;
    in_stack_fffffffffffffe40 = uVar23 & 0xffffff;
    if ((fVar21 == 0.0) && (!NAN(fVar21))) {
      in_stack_fffffffffffffe40 =
           CONCAT13(local_80->InnerWindow->WindowBorderSize == 0.0,(int3)uVar23);
    }
  }
  if ((char)(in_stack_fffffffffffffe40 >> 0x18) == '\0') {
    __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x177,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
LAB_00238626:
  PushOverrideID(in_stack_fffffffffffffdf4);
  local_c8 = local_80->InnerWindow;
  local_80->HostIndentX = (local_c8->DC).Indent.x;
  (local_80->HostClipRect).Min = (local_c8->ClipRect).Min;
  (local_80->HostClipRect).Max = (local_c8->ClipRect).Max;
  local_80->HostSkipItems = (bool)(local_c8->SkipItems & 1);
  (local_80->HostBackupWorkRect).Min = (local_c8->WorkRect).Min;
  (local_80->HostBackupWorkRect).Max = (local_c8->WorkRect).Max;
  (local_80->HostBackupParentWorkRect).Min = (local_c8->ParentWorkRect).Min;
  (local_80->HostBackupParentWorkRect).Max = (local_c8->ParentWorkRect).Max;
  (local_80->HostBackupColumnsOffset).x = (local_40->DC).ColumnsOffset.x;
  local_80->HostBackupPrevLineSize = (local_c8->DC).PrevLineSize;
  local_80->HostBackupCurrLineSize = (local_c8->DC).CurrLineSize;
  local_80->HostBackupCursorMaxPos = (local_c8->DC).CursorMaxPos;
  local_80->HostBackupItemWidth = (local_40->DC).ItemWidth;
  local_80->HostBackupItemWidthStackSize = (local_40->DC).ItemWidthStack.Size;
  ImVec2::ImVec2(&local_d0,0.0,0.0);
  (local_c8->DC).CurrLineSize = local_d0;
  (local_c8->DC).PrevLineSize = (local_c8->DC).CurrLineSize;
  if ((local_1c & 0x400000) == 0) {
    local_d1 = (local_1c & 0x200000) != 0 || (local_1c & 0x400) != 0;
  }
  else {
    local_d1 = false;
  }
  local_d2 = -((local_1c & 0x800000) == 0) & 1;
  local_1d8 = 1.0;
  if ((local_1c & 0x200) == 0) {
    local_1d8 = 0.0;
  }
  local_d8 = local_1d8;
  if ((local_d2 == 0) || ((local_1c & 0x200) != 0)) {
    local_dc = 0.0;
  }
  else {
    local_dc = (local_38->Style).CellPadding.x;
  }
  if ((local_d2 == 0) || ((local_1c & 0x200) == 0)) {
    local_e0 = 0.0;
  }
  else {
    local_e0 = (local_38->Style).CellPadding.x;
  }
  local_80->CellSpacingX1 = local_dc + local_1d8;
  local_80->CellSpacingX2 = local_dc;
  local_80->CellPaddingX = local_e0;
  local_80->CellPaddingY = (local_38->Style).CellPadding.y;
  uVar22 = 0;
  local_e4 = 1.0;
  if ((local_1c & 0x400) == 0) {
    local_e4 = 0.0;
  }
  if ((bool)local_d1 == false) {
    fVar21 = 0.0;
  }
  else {
    fVar21 = (local_38->Style).CellPadding.x;
  }
  local_80->OuterPaddingX = (local_e4 + fVar21) - local_80->CellPaddingX;
  local_80->CurrentColumn = -1;
  local_80->CurrentRow = -1;
  local_80->RowBgColorCounter = 0;
  *(uint *)&local_80->field_0x90 = *(uint *)&local_80->field_0x90 & 0xffff;
  if (local_c8 == local_40) {
    r = &local_80->WorkRect;
  }
  else {
    r = &local_c8->ClipRect;
  }
  (local_80->InnerClipRect).Min = r->Min;
  (local_80->InnerClipRect).Max = r->Max;
  local_e8 = fVar21;
  ImRect::ClipWith((ImRect *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (ImRect *)in_stack_fffffffffffffdf8);
  ImRect::ClipWithFull((ImRect *)CONCAT44(uVar22,fVar21),r);
  columns_count_00 = (int)((ulong)r >> 0x20);
  if ((local_1c & 0x20000) == 0) {
    idx = (local_c8->ClipRect).Max.y;
  }
  else {
    idx = ImMin<float>((local_80->InnerClipRect).Max.y,(local_c8->WorkRect).Max.y);
  }
  (local_80->InnerClipRect).Max.y = idx;
  fVar9 = (local_80->WorkRect).Min.y;
  local_80->RowPosY2 = fVar9;
  local_80->RowPosY1 = fVar9;
  local_80->RowTextBaseline = 0.0;
  local_80->FreezeRowsCount = '\0';
  local_80->FreezeRowsRequest = '\0';
  local_80->FreezeColumnsCount = '\0';
  local_80->FreezeColumnsRequest = '\0';
  local_80->IsUnfrozenRows = true;
  local_80->DeclColumnsCount = '\0';
  IVar5 = GetColorU32((ImGuiCol)idx,in_stack_fffffffffffffe00);
  local_80->BorderColorStrong = IVar5;
  IVar5 = GetColorU32((ImGuiCol)idx,in_stack_fffffffffffffe00);
  local_80->BorderColorLight = IVar5;
  local_ec = ImPool<ImGuiTable>::GetIndex
                       ((ImPool<ImGuiTable> *)CONCAT44(idx,in_stack_fffffffffffffe00),
                        in_stack_fffffffffffffdf8);
  pIVar20 = &local_38->CurrentTableStack;
  ImGuiPtrOrIndex::ImGuiPtrOrIndex(&local_100,local_ec);
  ImVector<ImGuiPtrOrIndex>::push_back
            ((ImVector<ImGuiPtrOrIndex> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (ImGuiPtrOrIndex *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_38->CurrentTable = local_80;
  (local_40->DC).CurrentTableIdx = local_ec;
  if (local_c8 != local_40) {
    (local_c8->DC).CurrentTableIdx = local_ec;
  }
  if (((local_8c & 2) != 0) && ((local_1c & 2) == 0)) {
    local_80->IsResetDisplayOrderRequest = true;
  }
  if ((local_38->TablesLastTimeActive).Size <= local_ec) {
    local_104 = 0xbf800000;
    ImVector<float>::resize
              ((ImVector<float> *)CONCAT44(idx,in_stack_fffffffffffffe00),
               (int)((ulong)pIVar20 >> 0x20),
               (float *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  fVar9 = (float)local_38->Time;
  pfVar6 = ImVector<float>::operator[]
                     ((ImVector<float> *)CONCAT44(fVar9,in_stack_fffffffffffffdf0),
                      (int)in_stack_fffffffffffffdec);
  *pfVar6 = fVar9;
  local_80->MemoryCompacted = false;
  local_108 = ImSpan<ImGuiTableColumn>::size(&local_80->Columns);
  if ((local_108 != 0) && (local_108 != local_18)) {
    MemFree((void *)CONCAT44(fVar9,in_stack_fffffffffffffdf0));
    local_80->RawData = (void *)0x0;
  }
  if (local_80->RawData == (void *)0x0) {
    TableBeginInitMemory((ImGuiTable *)CONCAT44(uVar22,fVar21),columns_count_00);
    local_80->IsSettingsRequestLoad = true;
    local_80->IsInitializing = true;
  }
  if ((local_80->IsResetAllRequest & 1U) != 0) {
    TableResetSettings(local_80);
  }
  if ((local_80->IsInitializing & 1U) != 0) {
    local_80->SettingsOffset = -1;
    local_80->IsSortSpecsDirty = true;
    local_80->InstanceInteracted = -1;
    local_80->ContextPopupColumn = -1;
    local_80->LastResizedColumn = -1;
    local_80->ResizedColumn = -1;
    local_80->ReorderColumn = -1;
    local_80->AutoFitSingleColumn = -1;
    local_80->HoveredColumnBorder = -1;
    local_80->HoveredColumnBody = -1;
    for (local_10c = 0; local_10c < local_18; local_10c = local_10c + 1) {
      local_118 = ImSpan<ImGuiTableColumn>::operator[]
                            ((ImSpan<ImGuiTableColumn> *)CONCAT44(idx,in_stack_fffffffffffffe00),
                             (int)((ulong)pIVar20 >> 0x20));
      local_11c = local_118->WidthAuto;
      ImGuiTableColumn::ImGuiTableColumn
                ((ImGuiTableColumn *)CONCAT44(fVar9,in_stack_fffffffffffffdf0));
      memcpy(local_118,local_184,0x66);
      local_118->WidthAuto = local_11c;
      local_118->IsPreserveWidthAuto = true;
      in_stack_fffffffffffffdf0 = CONCAT13((char)local_10c,(int3)in_stack_fffffffffffffdf0);
      pcVar7 = ImSpan<signed_char>::operator[]
                         ((ImSpan<signed_char> *)CONCAT44(idx,in_stack_fffffffffffffe00),
                          (int)((ulong)pIVar20 >> 0x20));
      IVar19 = (ImGuiTableColumnIdx)((uint)in_stack_fffffffffffffdf0 >> 0x18);
      *pcVar7 = IVar19;
      local_118->DisplayOrder = IVar19;
      local_118->IsEnabledNextFrame = true;
      local_118->IsEnabled = true;
    }
  }
  if ((local_80->IsSettingsRequestLoad & 1U) != 0) {
    TableLoadSettings((ImGuiTable *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  fVar21 = local_38->FontSize;
  if (((local_80->RefScale != 0.0) || (NAN(local_80->RefScale))) &&
     ((local_80->RefScale != fVar21 || (NAN(local_80->RefScale) || NAN(fVar21))))) {
    fVar1 = local_80->RefScale;
    for (local_190 = 0; local_190 < local_18; local_190 = local_190 + 1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)CONCAT44(idx,in_stack_fffffffffffffe00),
                          (int)((ulong)pIVar20 >> 0x20));
      in_stack_fffffffffffffdec = pIVar8->WidthRequest * (fVar21 / fVar1);
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)CONCAT44(idx,in_stack_fffffffffffffe00),
                          (int)((ulong)pIVar20 >> 0x20));
      pIVar8->WidthRequest = in_stack_fffffffffffffdec;
    }
  }
  local_80->RefScale = fVar21;
  local_c8->SkipItems = true;
  if (0 < (local_80->ColumnsNames).Buf.Size) {
    ImVector<char>::resize
              ((ImVector<char> *)CONCAT44(fVar9,in_stack_fffffffffffffdf0),
               (int)in_stack_fffffffffffffdec);
  }
  TableBeginApplyRequests((ImGuiTable *)CONCAT44(iVar25,uVar24));
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostBackupWorkRect = inner_window->WorkRect;
    table->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    table->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    table->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    table->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    table->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    table->HostBackupItemWidth = outer_window->DC.ItemWidth;
    table->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(table_idx));
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
    {
        IM_FREE(table->RawData);
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            float width_auto = column->WidthAuto;
            *column = ImGuiTableColumn();
            column->WidthAuto = width_auto;
            column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
            column->IsEnabled = column->IsEnabledNextFrame = true;
        }
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}